

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O0

void __thiscall absl::lts_20250127::log_internal::LogMessage::LogBacktraceIfNeeded(LogMessage *this)

{
  bool bVar1;
  int iVar2;
  pointer pLVar3;
  type message_data;
  ostream *poVar4;
  undefined1 local_98 [8];
  OstreamView view;
  LogMessage *this_local;
  
  bVar1 = log_internal::IsInitialized();
  if (bVar1) {
    pLVar3 = std::
             unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             ::operator->(&this->data_);
    join_0x00000010_0x00000000_ = LogEntry::source_basename(&pLVar3->entry);
    pLVar3 = std::
             unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             ::operator->(&this->data_);
    iVar2 = LogEntry::source_line(&pLVar3->entry);
    bVar1 = ShouldLogBacktraceAt(stack0xffffffffffffffe0,iVar2);
    if (bVar1) {
      message_data = std::
                     unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                     ::operator*(&this->data_);
      OstreamView::OstreamView((OstreamView *)local_98,message_data);
      poVar4 = OstreamView::stream((OstreamView *)local_98);
      std::operator<<(poVar4," (stacktrace:\n");
      iVar2 = MaxFramesInLogStackTrace();
      bVar1 = ShouldSymbolizeLogStackTrace();
      poVar4 = OstreamView::stream((OstreamView *)local_98);
      debugging_internal::DumpStackTrace(1,iVar2,bVar1,anon_unknown_4::WriteToStream,poVar4);
      poVar4 = OstreamView::stream((OstreamView *)local_98);
      std::operator<<(poVar4,") ");
      OstreamView::~OstreamView((OstreamView *)local_98);
    }
  }
  return;
}

Assistant:

void LogMessage::LogBacktraceIfNeeded() {
  if (!absl::log_internal::IsInitialized()) return;

  if (!absl::log_internal::ShouldLogBacktraceAt(data_->entry.source_basename(),
                                                data_->entry.source_line()))
    return;
  OstreamView view(*data_);
  view.stream() << " (stacktrace:\n";
  debugging_internal::DumpStackTrace(
      1, log_internal::MaxFramesInLogStackTrace(),
      log_internal::ShouldSymbolizeLogStackTrace(), WriteToStream,
      &view.stream());
  view.stream() << ") ";
}